

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedFieldInfo.cpp
# Opt level: O0

void FixedFieldInfo::PopulateFixedField(Type *type,Var var,FixedFieldInfo *fixed)

{
  bool bVar1;
  TSize TVar2;
  LocalFunctionId LVar3;
  FunctionInfo *pFVar4;
  ScriptFunction *this;
  FrameDisplay *ptr;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  JavascriptFunction *local_30;
  JavascriptFunction *funcObj;
  FixedFieldIDL *rawFF;
  FixedFieldInfo *fixed_local;
  Var var_local;
  Type *type_local;
  
  rawFF = &fixed->m_data;
  fixed_local = (FixedFieldInfo *)var;
  var_local = type;
  funcObj = (JavascriptFunction *)GetRaw(fixed);
  Memory::WriteBarrierPtr<void>::operator=(&((FixedFieldIDL *)funcObj)->fieldValue,fixed_local);
  *(undefined1 *)
   ((long)&(funcObj->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
           super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 2) = 0;
  if ((fixed_local != (FixedFieldInfo *)0x0) &&
     (bVar1 = Js::VarIs<Js::JavascriptFunction>(fixed_local), bVar1)) {
    local_30 = Js::VarTo<Js::JavascriptFunction>(fixed_local);
    local_32.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::FromObject((RecyclableObject *)local_30);
    TVar2 = ValueType::GetRawData((ValueType *)&local_32.field_0);
    *(TSize *)&(funcObj->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = TVar2;
    pFVar4 = Js::JavascriptFunction::GetFunctionInfo(local_30);
    Memory::WriteBarrierPtr<void>::operator=
              ((WriteBarrierPtr<void> *)&funcObj[1].constructorCache,pFVar4);
    pFVar4 = Js::JavascriptFunction::GetFunctionInfo(local_30);
    bVar1 = Js::FunctionInfo::IsClassConstructor(pFVar4);
    *(bool *)((long)&(funcObj->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                     super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 3) = bVar1;
    pFVar4 = Js::JavascriptFunction::GetFunctionInfo(local_30);
    LVar3 = Js::FunctionInfo::GetLocalFunctionId(pFVar4);
    *(LocalFunctionId *)
     ((long)&(funcObj->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 4) = LVar3;
    bVar1 = Js::VarIs<Js::ScriptFunction>(fixed_local);
    if (bVar1) {
      this = Js::VarTo<Js::ScriptFunction,Js::JavascriptFunction>(local_30);
      ptr = Js::ScriptFunction::GetEnvironment(this);
      Memory::WriteBarrierPtr<void>::operator=
                ((WriteBarrierPtr<void> *)&funcObj[1].functionInfo,ptr);
    }
  }
  if (var_local != (Var)0x0) {
    JITType::BuildFromJsType
              ((Type *)var_local,
               (JITType *)&(funcObj->super_DynamicObject).super_RecyclableObject.type);
  }
  return;
}

Assistant:

void
FixedFieldInfo::PopulateFixedField(_In_opt_ Js::Type * type, _In_opt_ Js::Var var, _Out_ FixedFieldInfo * fixed)
{
    FixedFieldIDL * rawFF = fixed->GetRaw();
    rawFF->fieldValue = var;
    rawFF->nextHasSameFixedField = false;
    if (var != nullptr && Js::VarIs<Js::JavascriptFunction>(var))
    {
        Js::JavascriptFunction * funcObj = Js::VarTo<Js::JavascriptFunction>(var);
        rawFF->valueType = ValueType::FromObject(funcObj).GetRawData();
        rawFF->funcInfoAddr = (void*)funcObj->GetFunctionInfo();
        rawFF->isClassCtor = funcObj->GetFunctionInfo()->IsClassConstructor();
        rawFF->localFuncId = funcObj->GetFunctionInfo()->GetLocalFunctionId();
        if (Js::VarIs<Js::ScriptFunction>(var))
        {
            rawFF->environmentAddr = (void*)Js::VarTo<Js::ScriptFunction>(funcObj)->GetEnvironment();
        }
    }
    if (type != nullptr)
    {
        JITType::BuildFromJsType(type, (JITType*)&rawFF->type);
    }
}